

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int run_test_spawn_stdout(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  undefined8 uVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_stdio_container_t stdio [2];
  uv_pipe_t out;
  
  init_process_options("spawn_helper2",exit_cb);
  puVar2 = uv_default_loop();
  uv_pipe_init(puVar2,&out,0);
  options.stdio = stdio;
  stdio[0].flags = UV_IGNORE;
  stdio[1].flags = UV_WRITABLE_PIPE|UV_CREATE_PIPE;
  options.stdio_count = 2;
  stdio[1].data.stream = (uv_stream_t *)&out;
  puVar2 = uv_default_loop();
  iVar1 = uv_spawn(puVar2,&process,&options);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_read_start((uv_stream_t *)&out,on_alloc,on_read);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        eval_a = 1;
        eval_b = (int64_t)exit_cb_called;
        if (eval_b == 1) {
          eval_a = 2;
          eval_b = (int64_t)close_cb_called;
          if (eval_b == 2) {
            printf("output is: %s",output);
            iVar1 = strcmp("hello world\n",output);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              puVar2 = uv_default_loop();
              close_loop(puVar2);
              eval_a = 0;
              puVar2 = uv_default_loop();
              iVar1 = uv_loop_close(puVar2);
              eval_b = (int64_t)iVar1;
              if (eval_b == 0) {
                uv_library_shutdown();
                return 0;
              }
              pcVar5 = "uv_loop_close(uv_default_loop())";
              pcVar4 = "0";
              uVar3 = 0x13c;
            }
            else {
              pcVar5 = "0";
              pcVar4 = "strcmp(\"hello world\\n\", output)";
              uVar3 = 0x13a;
            }
          }
          else {
            pcVar5 = "close_cb_called";
            pcVar4 = "2";
            uVar3 = 0x138;
          }
        }
        else {
          pcVar5 = "exit_cb_called";
          pcVar4 = "1";
          uVar3 = 0x137;
        }
      }
      else {
        pcVar5 = "0";
        pcVar4 = "r";
        uVar3 = 0x135;
      }
    }
    else {
      pcVar5 = "0";
      pcVar4 = "r";
      uVar3 = 0x132;
    }
  }
  else {
    pcVar5 = "0";
    pcVar4 = "r";
    uVar3 = 0x12f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar3,pcVar4,"==",pcVar5,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(spawn_stdout) {
  int r;
  uv_pipe_t out;
  uv_stdio_container_t stdio[2];

  init_process_options("spawn_helper2", exit_cb);

  uv_pipe_init(uv_default_loop(), &out, 0);
  options.stdio = stdio;
  options.stdio[0].flags = UV_IGNORE;
  options.stdio[1].flags = UV_CREATE_PIPE | UV_WRITABLE_PIPE;
  options.stdio[1].data.stream = (uv_stream_t*) &out;
  options.stdio_count = 2;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT_OK(r);

  r = uv_read_start((uv_stream_t*) &out, on_alloc, on_read);
  ASSERT_OK(r);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, exit_cb_called);
  ASSERT_EQ(2, close_cb_called); /* Once for process once for the pipe. */
  printf("output is: %s", output);
  ASSERT_OK(strcmp("hello world\n", output));

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}